

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.c
# Opt level: O1

int gladLoaderLoadGL(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  _glad_gl_userptr userptr;
  long local_30;
  undefined8 local_28;
  
  lVar3 = 0;
  do {
    lVar2 = dlopen(*(undefined8 *)((long)gladLoaderLoadGL::NAMES + lVar3),1);
    if (lVar2 != 0) break;
    lVar3 = lVar3 + 8;
    lVar2 = 0;
  } while (lVar3 == 8);
  if (lVar2 == 0) {
    iVar1 = 0;
  }
  else {
    local_30 = lVar2;
    local_28 = dlsym(lVar2,"glXGetProcAddressARB");
    iVar1 = gladLoadGLUserPtr(glad_gl_get_proc,&local_30);
    dlclose(lVar2);
  }
  return iVar1;
}

Assistant:

int gladLoaderLoadGL(void) {
#ifdef __APPLE__
    static const char *NAMES[] = {
        "../Frameworks/OpenGL.framework/OpenGL",
        "/Library/Frameworks/OpenGL.framework/OpenGL",
        "/System/Library/Frameworks/OpenGL.framework/OpenGL",
        "/System/Library/Frameworks/OpenGL.framework/Versions/Current/OpenGL"
    };
#elif GLAD_PLATFORM_WIN32
    static const char *NAMES[] = {"opengl32.dll"};
#else
    static const char *NAMES[] = {
#if defined __CYGWIN__
        "libGL-1.so",
#endif
        "libGL.so.1",
        "libGL.so"
    };
#endif

    int version = 0;
    void *handle;
    struct _glad_gl_userptr userptr;

    handle = glad_get_dlopen_handle(NAMES, sizeof(NAMES) / sizeof(NAMES[0]));
    if (handle) {
        userptr.gl_handle = handle;
#ifdef __APPLE__
        userptr.gl_get_proc_address_ptr = NULL;
#elif GLAD_PLATFORM_WIN32
        userptr.gl_get_proc_address_ptr =
            (GLADglprocaddrfunc) glad_dlsym_handle(handle, "wglGetProcAddress");
#else
        userptr.gl_get_proc_address_ptr =
            (GLADglprocaddrfunc) glad_dlsym_handle(handle, "glXGetProcAddressARB");
#endif
        version = gladLoadGLUserPtr(glad_gl_get_proc, &userptr);

        glad_close_dlopen_handle(handle);
    }

    return version;
}